

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O1

int mbedtls_blowfish_crypt_cfb64
              (mbedtls_blowfish_context *ctx,int mode,size_t length,size_t *iv_off,uchar *iv,
              uchar *input,uchar *output)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar3 = *iv_off;
  if (mode == 0) {
    if (length != 0) {
      sVar4 = 0;
      do {
        if (sVar3 == 0) {
          mbedtls_blowfish_crypt_ecb(ctx,1,iv,iv);
        }
        bVar1 = input[sVar4];
        output[sVar4] = iv[sVar3] ^ bVar1;
        iv[sVar3] = bVar1;
        sVar3 = (size_t)((int)sVar3 + 1U & 7);
        sVar4 = sVar4 + 1;
      } while (length != sVar4);
    }
  }
  else if (length != 0) {
    sVar4 = 0;
    do {
      if (sVar3 == 0) {
        mbedtls_blowfish_crypt_ecb(ctx,1,iv,iv);
      }
      bVar1 = input[sVar4];
      bVar2 = iv[sVar3];
      output[sVar4] = bVar1 ^ bVar2;
      iv[sVar3] = bVar1 ^ bVar2;
      sVar3 = (size_t)((int)sVar3 + 1U & 7);
      sVar4 = sVar4 + 1;
    } while (length != sVar4);
  }
  *iv_off = sVar3;
  return 0;
}

Assistant:

int mbedtls_blowfish_crypt_cfb64( mbedtls_blowfish_context *ctx,
                       int mode,
                       size_t length,
                       size_t *iv_off,
                       unsigned char iv[MBEDTLS_BLOWFISH_BLOCKSIZE],
                       const unsigned char *input,
                       unsigned char *output )
{
    int c;
    size_t n = *iv_off;

    if( mode == MBEDTLS_BLOWFISH_DECRYPT )
    {
        while( length-- )
        {
            if( n == 0 )
                mbedtls_blowfish_crypt_ecb( ctx, MBEDTLS_BLOWFISH_ENCRYPT, iv, iv );

            c = *input++;
            *output++ = (unsigned char)( c ^ iv[n] );
            iv[n] = (unsigned char) c;

            n = ( n + 1 ) % MBEDTLS_BLOWFISH_BLOCKSIZE;
        }
    }
    else
    {
        while( length-- )
        {
            if( n == 0 )
                mbedtls_blowfish_crypt_ecb( ctx, MBEDTLS_BLOWFISH_ENCRYPT, iv, iv );

            iv[n] = *output++ = (unsigned char)( iv[n] ^ *input++ );

            n = ( n + 1 ) % MBEDTLS_BLOWFISH_BLOCKSIZE;
        }
    }

    *iv_off = n;

    return( 0 );
}